

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Generators<arg_res_tuple<double,_2UL>_> * __thiscall
Catch::Generators::
makeGenerators<arg_res_tuple<double,2ul>,arg_res_tuple<double,2ul>,arg_res_tuple<double,2ul>,arg_res_tuple<double,2ul>,arg_res_tuple<double,2ul>,arg_res_tuple<double,2ul>,arg_res_tuple<double,2ul>,arg_res_tuple<double,2ul>,arg_res_tuple<double,2ul>,arg_res_tuple<double,2ul>,arg_res_tuple<double,2ul>>
          (Generators<arg_res_tuple<double,_2UL>_> *__return_storage_ptr__,Generators *this,
          arg_res_tuple<double,_2UL> *val,arg_res_tuple<double,_2UL> *moreGenerators,
          arg_res_tuple<double,_2UL> *moreGenerators_1,arg_res_tuple<double,_2UL> *moreGenerators_2,
          arg_res_tuple<double,_2UL> *moreGenerators_3,arg_res_tuple<double,_2UL> *moreGenerators_4,
          arg_res_tuple<double,_2UL> *moreGenerators_5,arg_res_tuple<double,_2UL> *moreGenerators_6,
          arg_res_tuple<double,_2UL> *moreGenerators_7,arg_res_tuple<double,_2UL> *moreGenerators_8,
          arg_res_tuple<double,_2UL> *moreGenerators_9)

{
  long *local_38;
  
  value<arg_res_tuple<double,2ul>>((Generators *)&local_38,(arg_res_tuple<double,_2UL> *)this);
  Generators<arg_res_tuple<double,2ul>>::
  Generators<Catch::Generators::GeneratorWrapper<arg_res_tuple<double,2ul>>,arg_res_tuple<double,2ul>,arg_res_tuple<double,2ul>,arg_res_tuple<double,2ul>,arg_res_tuple<double,2ul>,arg_res_tuple<double,2ul>,arg_res_tuple<double,2ul>,arg_res_tuple<double,2ul>,arg_res_tuple<double,2ul>,arg_res_tuple<double,2ul>,arg_res_tuple<double,2ul>>
            ((Generators<arg_res_tuple<double,2ul>> *)__return_storage_ptr__,
             (GeneratorWrapper<arg_res_tuple<double,_2UL>_> *)&local_38,val,moreGenerators,
             moreGenerators_1,moreGenerators_2,moreGenerators_3,moreGenerators_4,moreGenerators_5,
             moreGenerators_6,moreGenerators_7,moreGenerators_8);
  if (local_38 != (long *)0x0) {
    (**(code **)(*local_38 + 8))();
  }
  return __return_storage_ptr__;
}

Assistant:

auto makeGenerators( T&& val, Gs &&... moreGenerators ) -> Generators<T> {
        return makeGenerators( value( std::forward<T>( val ) ), std::forward<Gs>( moreGenerators )... );
    }